

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

shared_ptr<wallet::CWallet> __thiscall
wallet::GetWallet(wallet *this,WalletContext *context,string *name)

{
  pointer psVar1;
  pointer __s2;
  size_t __n;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer psVar5;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar6;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(context->wallets_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  psVar5 = (context->wallets).
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (context->wallets).
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      peVar2 = (psVar5->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->m_name)._M_string_length == __n) {
        if (__n != 0) {
          iVar4 = bcmp((peVar2->m_name)._M_dataplus._M_p,__s2,__n);
          if (iVar4 != 0) goto LAB_0051f3f2;
        }
        *(element_type **)this = peVar2;
        p_Var3 = (psVar5->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(p_Var3 + 8) = *(int *)(p_Var3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(p_Var3 + 8) = *(int *)(p_Var3 + 8) + 1;
          }
        }
        goto LAB_0051f401;
      }
LAB_0051f3f2:
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0051f401:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> GetWallet(WalletContext& context, const std::string& name)
{
    LOCK(context.wallets_mutex);
    for (const std::shared_ptr<CWallet>& wallet : context.wallets) {
        if (wallet->GetName() == name) return wallet;
    }
    return nullptr;
}